

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

void nlohmann::detail::dtoa_impl::grisu2_round
               (char *buf,int len,uint64_t dist,uint64_t delta,uint64_t rest,uint64_t ten_k)

{
  bool bVar1;
  uint64_t ten_k_local;
  uint64_t rest_local;
  uint64_t delta_local;
  uint64_t dist_local;
  int len_local;
  char *buf_local;
  
  if (len < 1) {
    __assert_fail("len >= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/simonhochrein[P]soul-lsp/include/nlohmann/json.hpp"
                  ,0x3a23,
                  "void nlohmann::detail::dtoa_impl::grisu2_round(char *, int, std::uint64_t, std::uint64_t, std::uint64_t, std::uint64_t)"
                 );
  }
  if (delta < dist) {
    __assert_fail("dist <= delta",
                  "/workspace/llm4binary/github/license_c_cmakelists/simonhochrein[P]soul-lsp/include/nlohmann/json.hpp"
                  ,0x3a24,
                  "void nlohmann::detail::dtoa_impl::grisu2_round(char *, int, std::uint64_t, std::uint64_t, std::uint64_t, std::uint64_t)"
                 );
  }
  if (delta < rest) {
    __assert_fail("rest <= delta",
                  "/workspace/llm4binary/github/license_c_cmakelists/simonhochrein[P]soul-lsp/include/nlohmann/json.hpp"
                  ,0x3a25,
                  "void nlohmann::detail::dtoa_impl::grisu2_round(char *, int, std::uint64_t, std::uint64_t, std::uint64_t, std::uint64_t)"
                 );
  }
  ten_k_local = rest;
  if (ten_k == 0) {
    __assert_fail("ten_k > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/simonhochrein[P]soul-lsp/include/nlohmann/json.hpp"
                  ,0x3a26,
                  "void nlohmann::detail::dtoa_impl::grisu2_round(char *, int, std::uint64_t, std::uint64_t, std::uint64_t, std::uint64_t)"
                 );
  }
  while( true ) {
    bVar1 = false;
    if (((ten_k_local < dist) && (bVar1 = false, ten_k <= delta - ten_k_local)) &&
       (bVar1 = true, dist <= ten_k_local + ten_k)) {
      bVar1 = (ten_k_local + ten_k) - dist < dist - ten_k_local;
    }
    if (!bVar1) break;
    if (buf[len + -1] == '0') {
      __assert_fail("buf[len - 1] != \'0\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/simonhochrein[P]soul-lsp/include/nlohmann/json.hpp"
                    ,0x3a3f,
                    "void nlohmann::detail::dtoa_impl::grisu2_round(char *, int, std::uint64_t, std::uint64_t, std::uint64_t, std::uint64_t)"
                   );
    }
    buf[len + -1] = buf[len + -1] + -1;
    ten_k_local = ten_k + ten_k_local;
  }
  return;
}

Assistant:

inline void grisu2_round(char* buf, int len, std::uint64_t dist, std::uint64_t delta,
                         std::uint64_t rest, std::uint64_t ten_k)
{
    JSON_ASSERT(len >= 1);
    JSON_ASSERT(dist <= delta);
    JSON_ASSERT(rest <= delta);
    JSON_ASSERT(ten_k > 0);

    //               <--------------------------- delta ---->
    //                                  <---- dist --------->
    // --------------[------------------+-------------------]--------------
    //               M-                 w                   M+
    //
    //                                  ten_k
    //                                <------>
    //                                       <---- rest ---->
    // --------------[------------------+----+--------------]--------------
    //                                  w    V
    //                                       = buf * 10^k
    //
    // ten_k represents a unit-in-the-last-place in the decimal representation
    // stored in buf.
    // Decrement buf by ten_k while this takes buf closer to w.

    // The tests are written in this order to avoid overflow in unsigned
    // integer arithmetic.

    while (rest < dist
            && delta - rest >= ten_k
            && (rest + ten_k < dist || dist - rest > rest + ten_k - dist))
    {
        JSON_ASSERT(buf[len - 1] != '0');
        buf[len - 1]--;
        rest += ten_k;
    }
}